

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode setup_range(Curl_easy *data)

{
  undefined1 *puVar1;
  char *pcVar2;
  ushort uVar3;
  long lVar4;
  
  lVar4 = (data->set).set_resume_from;
  (data->state).resume_from = lVar4;
  if ((lVar4 == 0) && ((data->set).str[0x17] == (char *)0x0)) {
    puVar1 = &(data->state).field_0x4e5;
    *puVar1 = *puVar1 & 0xfd;
  }
  else {
    if (((data->state).field_0x4e5 & 4) != 0) {
      (*Curl_cfree)((data->state).range);
      lVar4 = (data->state).resume_from;
    }
    if (lVar4 == 0) {
      pcVar2 = (*Curl_cstrdup)((data->set).str[0x17]);
    }
    else {
      pcVar2 = curl_maprintf("%ld-");
    }
    uVar3 = (ushort)*(undefined4 *)&(data->state).field_0x4e4 & 0xfbff |
            (ushort)(pcVar2 != (char *)0x0) << 10;
    (data->state).range = pcVar2;
    *(ushort *)&(data->state).field_0x4e4 = uVar3;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(ushort *)&(data->state).field_0x4e4 = uVar3 | 0x200;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct Curl_easy *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" CURL_FORMAT_CURL_OFF_T "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    s->rangestringalloc = (s->range) ? TRUE : FALSE;

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}